

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

Matrix3f * operator*(Matrix3f *__return_storage_ptr__,Matrix3f *x,Matrix3f *y)

{
  float fVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int i;
  long lVar4;
  undefined8 *unaff_RBX;
  Matrix3f *product;
  float *pfVar5;
  int j;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar9 [16];
  
  auVar2 = vpmovsxbq_avx2(ZEXT416(0x24180c00));
  auVar3 = vpmovsxbq_avx2(ZEXT416(0x60300));
  __return_storage_ptr__->m_elements[8] = 0.0;
  lVar4 = 0;
  __return_storage_ptr__->m_elements[0] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  auVar11 = vpbroadcastq_avx512vl();
  uVar7 = CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),7) & 0xffffffff;
  do {
    auVar12 = vpbroadcastq_avx512vl();
    lVar6 = 0;
    auVar12 = vpsllq_avx2(auVar12,2);
    auVar12 = vpaddq_avx2(auVar12,auVar11);
    auVar12 = vpaddq_avx2(auVar12,auVar2);
    pfVar5 = x->m_elements;
    do {
      auVar13 = vpbroadcastq_avx512vl();
      lVar6 = lVar6 + 1;
      vpaddq_avx2(auVar13,auVar3);
      auVar8 = vgatherqps_avx512vl(*(undefined8 *)y->m_elements);
      auVar9._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar8._8_8_;
      auVar9._0_8_ = (ulong)((byte)uVar7 & 1) * auVar8._0_8_;
      auVar8 = vgatherqps_avx512vl(*unaff_RBX);
      auVar10._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar8._8_8_;
      auVar10._0_8_ = (ulong)((byte)uVar7 & 1) * auVar8._0_8_;
      fVar1 = *pfVar5;
      auVar8._4_4_ = fVar1;
      auVar8._0_4_ = fVar1;
      auVar8._8_4_ = fVar1;
      auVar8._12_4_ = fVar1;
      auVar8 = vfmadd231ps_avx512vl(auVar10,auVar9,auVar8);
      pfVar5 = pfVar5 + 3;
      vscatterqps_avx512vl(ZEXT832(0) + auVar12,uVar7,auVar8);
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    x = (Matrix3f *)((long)x + 4);
  } while (lVar4 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix3f operator * ( const Matrix3f& x, const Matrix3f& y )
{
	Matrix3f product; // zeroes

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			for( int k = 0; k < 3; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}